

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeCommandListAppendMemoryRangesBarrier
          (ze_command_list_handle_t hCommandList,uint32_t numRanges,size_t *pRangeSizes,
          void **pRanges,ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,
          ze_event_handle_t *phWaitEvents)

{
  code *pcVar1;
  undefined8 uVar2;
  ulong uVar3;
  void *pvVar4;
  undefined8 local_68;
  ulong local_60;
  size_t i;
  ze_event_handle_t *phWaitEventsLocal;
  ze_pfnCommandListAppendMemoryRangesBarrier_t pfnAppendMemoryRangesBarrier;
  dditable_t *dditable;
  ze_result_t result;
  uint32_t numWaitEvents_local;
  ze_event_handle_t hSignalEvent_local;
  void **pRanges_local;
  size_t *pRangeSizes_local;
  uint32_t numRanges_local;
  ze_command_list_handle_t hCommandList_local;
  
  pcVar1 = *(code **)(*(long *)(hCommandList + 8) + 0x248);
  if (pcVar1 == (code *)0x0) {
    hCommandList_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    uVar2 = *(undefined8 *)hCommandList;
    if (hSignalEvent == (ze_event_handle_t)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = *(undefined8 *)hSignalEvent;
    }
    uVar3 = SUB168(ZEXT416(numWaitEvents) * ZEXT816(8),0);
    if (SUB168(ZEXT416(numWaitEvents) * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    for (local_60 = 0; phWaitEvents != (ze_event_handle_t *)0x0 && local_60 < numWaitEvents;
        local_60 = local_60 + 1) {
      *(undefined8 *)((long)pvVar4 + local_60 * 8) = *(undefined8 *)phWaitEvents[local_60];
    }
    hCommandList_local._4_4_ =
         (*pcVar1)(uVar2,numRanges,pRangeSizes,pRanges,local_68,numWaitEvents,pvVar4);
    if (pvVar4 != (void *)0x0) {
      operator_delete__(pvVar4);
    }
  }
  return hCommandList_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendMemoryRangesBarrier(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        uint32_t numRanges,                             ///< [in] number of memory ranges
        const size_t* pRangeSizes,                      ///< [in][range(0, numRanges)] array of sizes of memory range
        const void** pRanges,                           ///< [in][range(0, numRanges)] array of memory ranges
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before executing barrier;
                                                        ///< must be 0 if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before executing barrier
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->dditable;
        auto pfnAppendMemoryRangesBarrier = dditable->ze.CommandList.pfnAppendMemoryRangesBarrier;
        if( nullptr == pfnAppendMemoryRangesBarrier )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hCommandList = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->handle;

        // convert loader handle to driver handle
        hSignalEvent = ( hSignalEvent ) ? reinterpret_cast<ze_event_object_t*>( hSignalEvent )->handle : nullptr;

        // convert loader handles to driver handles
        auto phWaitEventsLocal = new ze_event_handle_t [numWaitEvents];
        for( size_t i = 0; ( nullptr != phWaitEvents ) && ( i < numWaitEvents ); ++i )
            phWaitEventsLocal[ i ] = reinterpret_cast<ze_event_object_t*>( phWaitEvents[ i ] )->handle;

        // forward to device-driver
        result = pfnAppendMemoryRangesBarrier( hCommandList, numRanges, pRangeSizes, pRanges, hSignalEvent, numWaitEvents, phWaitEventsLocal );
        delete []phWaitEventsLocal;

        return result;
    }